

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O2

ostringstream * toml::detail::format_empty_line(ostringstream *oss,size_t lnw)

{
  ostream *poVar1;
  ostream *poVar2;
  char in_CL;
  string local_30;
  
  make_string_abi_cxx11_(&local_30,(detail *)(lnw + 1),0x20,in_CL);
  poVar1 = std::operator<<((ostream *)oss,(string *)&local_30);
  poVar2 = color::ansi::bold((ostream *)poVar1);
  poVar2 = color::ansi::blue(poVar2);
  poVar1 = std::operator<<((ostream *)poVar2," |\n");
  color::ansi::reset((ostream *)poVar1);
  std::__cxx11::string::~string((string *)&local_30);
  return oss;
}

Assistant:

TOML11_INLINE std::ostringstream& format_empty_line(std::ostringstream& oss,
        const std::size_t lnw)
{
    //    |
    oss << detail::make_string(lnw + 1, ' ')
        << color::bold << color::blue << " |\n"  << color::reset;
    return oss;
}